

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_matrix_sparse.cpp
# Opt level: O1

void __thiscall
test_matrix_sparse_begin_Test::~test_matrix_sparse_begin_Test(test_matrix_sparse_begin_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(test_matrix_sparse, begin) {
  Matrix_Sparse matrix({0, 1, 2}, {1, 1}, {1.0, 2.0}, 2);

  // These are more indirect checks, but essentially we should be looking at row 0 data.
  auto iter = matrix.begin();
  EXPECT_DOUBLE_EQ(iter[0][1], 1.0);
  EXPECT_DOUBLE_EQ(iter[0].begin().i_row(), 0);
  EXPECT_DOUBLE_EQ(iter[0].begin().i_column(), 1);

  auto iter_const = matrix.cbegin();
  EXPECT_DOUBLE_EQ(iter_const[0][1], 1.0);
  EXPECT_DOUBLE_EQ(iter_const[0].begin().i_row(), 0);
  EXPECT_DOUBLE_EQ(iter_const[0].begin().i_column(), 1);
}